

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

url_mapper * __thiscall cppcms::url_mapper::topmost(url_mapper *this)

{
  application *paVar1;
  url_mapper *puVar2;
  application *this_00;
  
  this_00 = ((this->d).ptr_)->this_application;
  if (this_00 != (application *)0x0) {
    while( true ) {
      puVar2 = application::mapper(this_00);
      paVar1 = ((puVar2->d).ptr_)->parent;
      this = application::mapper(this_00);
      if (paVar1 == (application *)0x0) break;
      this_00 = ((this->d).ptr_)->parent;
    }
  }
  return this;
}

Assistant:

url_mapper &url_mapper::topmost()
	{
		application *app = d->this_application;
		if(!app)
			return *this;
		while(app->mapper().d->parent)
			app = app->mapper().d->parent;
		return app->mapper();
	}